

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O1

SyntaxPrinter * __thiscall
slang::syntax::SyntaxPrinter::append(SyntaxPrinter *this,string_view text)

{
  char cVar1;
  size_type sVar2;
  ulong uVar3;
  ulong __n;
  char *__s;
  bool bVar4;
  bool bVar5;
  
  __s = text._M_str;
  __n = text._M_len;
  if (this->squashNewlines == false) goto LAB_001b1cec;
  if (__n == 0) {
LAB_001b1c84:
    bVar5 = false;
    bVar4 = false;
  }
  else {
    cVar1 = *__s;
    bVar4 = cVar1 == '\r';
    if ((!bVar4) && (cVar1 != '\n')) goto LAB_001b1c84;
    uVar3 = (ulong)(cVar1 == '\r');
    if (uVar3 < __n) {
      bVar5 = __s[uVar3] == '\n';
      if (bVar5) {
        uVar3 = (ulong)(cVar1 == '\r') + 1;
      }
    }
    else {
      bVar5 = false;
    }
    for (; uVar3 < __n; uVar3 = uVar3 + 1) {
      if ((__s[uVar3] == '\r') || (__s[uVar3] == '\n')) {
        uVar3 = uVar3 + 1;
      }
    }
    if (__n < uVar3) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar3,__n);
    }
    __s = __s + uVar3;
    __n = __n - uVar3;
  }
  sVar2 = (this->buffer)._M_string_length;
  if ((sVar2 == 0) || ((this->buffer)._M_dataplus._M_p[sVar2 - 1] != '\n')) {
    if (bVar4) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->buffer,'\r');
    }
    if (bVar5) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->buffer,'\n');
    }
  }
LAB_001b1cec:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&this->buffer,__s,__n);
  return this;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::append(std::string_view text) {
    if (!squashNewlines) {
        buffer.append(text);
        return *this;
    }

    bool carriage = false;
    bool newline = false;

    if (!text.empty() && (text[0] == '\r' || text[0] == '\n')) {
        size_t i = 0;
        if (text[i] == '\r') {
            carriage = true;
            i++;
        }

        if (i < text.length() && text[i] == '\n') {
            newline = true;
            i++;
        }

        for (; i < text.length(); i++) {
            if (text[i] == '\r' || text[i] == '\n')
                i++;
        }

        text = text.substr(i);
    }

    if (buffer.empty() || buffer.back() != '\n') {
        if (carriage)
            buffer.push_back('\r');
        if (newline)
            buffer.push_back('\n');
    }

    buffer.append(text);
    return *this;
}